

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

MapFlushCallStatistics *
deqp::gles3::Performance::anon_unknown_1::calculateSampleStatistics
          (MapFlushCallStatistics *__return_storage_ptr__,LineParametersWithConfidence *fit,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
          *samples)

{
  offset_in_SampleType_to_deUint64 in_RCX;
  MapFlushCallStatistics *stats;
  SingleOperationStatistics local_7c;
  SingleOperationStatistics local_68;
  SingleOperationStatistics local_54;
  SingleOperationStatistics local_40;
  SingleOperationStatistics local_2c;
  _anonymous_namespace_ *local_18;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  *samples_local;
  LineParametersWithConfidence *fit_local;
  
  local_18 = (_anonymous_namespace_ *)samples;
  samples_local =
       (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
        *)fit;
  Performance::(anonymous_namespace)::
  calculateBasicTransferStatistics<deqp::gles3::Performance::(anonymous_namespace)::MapFlushCallStatistics,deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (__return_storage_ptr__,fit,samples);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&local_2c,local_18,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x0,in_RCX);
  (__return_storage_ptr__->map).minTime = local_2c.minTime;
  (__return_storage_ptr__->map).maxTime = local_2c.maxTime;
  (__return_storage_ptr__->map).medianTime = local_2c.medianTime;
  (__return_storage_ptr__->map).min2DecileTime = local_2c.min2DecileTime;
  (__return_storage_ptr__->map).max9DecileTime = local_2c.max9DecileTime;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&local_40,local_18,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x8,in_RCX);
  (__return_storage_ptr__->unmap).minTime = local_40.minTime;
  (__return_storage_ptr__->unmap).maxTime = local_40.maxTime;
  (__return_storage_ptr__->unmap).medianTime = local_40.medianTime;
  (__return_storage_ptr__->unmap).min2DecileTime = local_40.min2DecileTime;
  (__return_storage_ptr__->unmap).max9DecileTime = local_40.max9DecileTime;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&local_54,local_18,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x10,in_RCX);
  (__return_storage_ptr__->write).minTime = local_54.minTime;
  (__return_storage_ptr__->write).maxTime = local_54.maxTime;
  (__return_storage_ptr__->write).medianTime = local_54.medianTime;
  (__return_storage_ptr__->write).min2DecileTime = local_54.min2DecileTime;
  (__return_storage_ptr__->write).max9DecileTime = local_54.max9DecileTime;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&local_68,local_18,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x18,in_RCX);
  (__return_storage_ptr__->flush).minTime = local_68.minTime;
  (__return_storage_ptr__->flush).maxTime = local_68.maxTime;
  (__return_storage_ptr__->flush).medianTime = local_68.medianTime;
  (__return_storage_ptr__->flush).min2DecileTime = local_68.min2DecileTime;
  (__return_storage_ptr__->flush).max9DecileTime = local_68.max9DecileTime;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&local_7c,local_18,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x20,in_RCX);
  (__return_storage_ptr__->alloc).minTime = local_7c.minTime;
  (__return_storage_ptr__->alloc).maxTime = local_7c.maxTime;
  (__return_storage_ptr__->alloc).medianTime = local_7c.medianTime;
  (__return_storage_ptr__->alloc).min2DecileTime = local_7c.min2DecileTime;
  (__return_storage_ptr__->alloc).max9DecileTime = local_7c.max9DecileTime;
  return __return_storage_ptr__;
}

Assistant:

static MapFlushCallStatistics calculateSampleStatistics (const LineParametersWithConfidence& fit, const std::vector<UploadSampleResult<MapBufferRangeFlushDuration> >& samples)
{
	MapFlushCallStatistics stats;

	calculateBasicTransferStatistics(stats, fit, samples);

	stats.map	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::mapDuration);
	stats.unmap	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::unmapDuration);
	stats.write	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::writeDuration);
	stats.flush	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::flushDuration);
	stats.alloc	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::allocDuration);

	return stats;
}